

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O1

uint64_t __thiscall binlog::Session::addEventSource(Session *this,EventSource *eventSource)

{
  uint64_t uVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    eventSource->id = this->_nextSourceId;
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              (eventSource,&this->_sources);
    uVar1 = this->_nextSourceId;
    this->_nextSourceId = uVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return uVar1;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

inline std::uint64_t Session::addEventSource(EventSource eventSource)
{
  std::lock_guard<std::mutex> lock(_mutex);

  eventSource.id = _nextSourceId;
  serializeSizePrefixedTagged(eventSource, _sources);
  return _nextSourceId++;
}